

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMPointsToSet.h
# Opt level: O2

size_t __thiscall dg::DGLLVMPointsToSet::size(DGLLVMPointsToSet *this)

{
  size_t sVar1;
  
  sVar1 = ADT::
          SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
          ::size(&((this->super_LLVMPointsToSetImplTemplate<const_dg::pta::PointerIdPointsToSet_&>).
                  PTSet)->pointers);
  return sVar1;
}

Assistant:

size_t size() const override { return PTSet.size(); }